

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O2

int remoteSync(mpt_output *out,int timeout)

{
  mpt_outdata *out_00;
  mpt_buffer *pmVar1;
  mpt_stream *srm;
  _mpt_vptr_output *p_Var2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  _func_int_mpt_output_ptr__func_int_void_ptr_mpt_message_ptr_ptr_void_ptr **pp_Var7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  byte *pbVar12;
  ulong uVar13;
  bool bVar14;
  int local_64;
  uint64_t ansid;
  pollfd p;
  
  uVar6 = (ulong)*(byte *)((long)&out[4]._vptr + 5);
  iVar9 = 0;
  if (uVar6 != 0) {
    out_00 = (mpt_outdata *)(out + 3);
    if (*(int *)&out[4]._vptr < 0) {
      srm = (mpt_stream *)(out_00->buf)._buf;
      if (srm != (mpt_stream *)0x0) {
        iVar9 = mpt_stream_sync(srm,uVar6,(mpt_array *)(out + 6),timeout);
        return iVar9;
      }
      iVar9 = -1;
    }
    else {
      local_64 = timeout;
      do {
        if (((ulong)out[4]._vptr & 0x2000000000) == 0) {
          p.events = 1;
          p.fd = *(int *)&out[4]._vptr;
          iVar3 = poll((pollfd *)&p,1,local_64);
          if (iVar3 < 0) {
            return -4;
          }
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = mpt_outdata_recv(out_00);
          if (iVar3 < 0) {
            mpt_log(0,"remoteSync",3,"%s: %s","receive failed","unable to get new data");
            return -4;
          }
          local_64 = 0;
        }
        pmVar1 = (out_00->buf)._buf;
        if (pmVar1 == (mpt_buffer *)0x0) {
LAB_00104496:
          pcVar10 = "remoteSync";
          pcVar8 = "%s: %s";
          pcVar11 = "bad message size";
          ansid = (uint64_t)"unable to get new data";
LAB_00104538:
          mpt_log(0,pcVar10,3,pcVar8,pcVar11,ansid);
          return -2;
        }
        uVar13 = (ulong)*(byte *)((long)&out[4]._vptr + 5);
        uVar6 = (ulong)*(byte *)((long)&out[4]._vptr + 6);
        if (pmVar1->_used < uVar6 + uVar13) goto LAB_00104496;
        if (-1 < *(char *)((long)&pmVar1[1]._vptr + uVar6)) {
          p_Var2 = out[6]._vptr;
          if (p_Var2 == (_mpt_vptr_output *)0x0) {
            return 0;
          }
          iVar9 = 0;
          uVar6 = (ulong)p_Var2[1].push / 0x18;
          pp_Var7 = &p_Var2[1].await;
          while (bVar14 = uVar6 != 0, uVar6 = uVar6 - 1, bVar14) {
            iVar9 = (iVar9 + 1) -
                    (uint)(*pp_Var7 ==
                          (_func_int_mpt_output_ptr__func_int_void_ptr_mpt_message_ptr_ptr_void_ptr
                           *)0x0);
            pp_Var7 = pp_Var7 + 3;
          }
          return iVar9;
        }
        pbVar12 = (byte *)((long)&out[4]._vptr + 4);
        *pbVar12 = *pbVar12 & 0xdf;
        pbVar12 = (byte *)((long)&pmVar1[1]._vptr + uVar6);
        *pbVar12 = *pbVar12 & 0x7f;
        uVar4 = mpt_message_buf2id(pbVar12,uVar13,&ansid);
        if (8 < uVar4) {
          mpt_log(0,"mpt::output::sync",3,"%s (%i)","bad message id",uVar4);
          return -2;
        }
        lVar5 = mpt_command_get(out + 6,ansid);
        if (lVar5 == 0) {
          pcVar10 = "mpt::output::sync";
          pcVar8 = "%s (%lx)";
          pcVar11 = "bad reply id";
          goto LAB_00104538;
        }
        p = (pollfd)(pmVar1->_used - uVar13);
        iVar3 = (**(code **)(lVar5 + 8))(*(undefined8 *)(lVar5 + 0x10),&p);
      } while (-1 < iVar3);
    }
  }
  return iVar9;
}

Assistant:

static int remoteSync(MPT_INTERFACE(output) *out, int timeout)
{
	static const char _func[] = "mpt::output::sync";
	
	MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, out, _out);
	int pos;
	
	if (!od->con.out._idlen) {
		return 0;
	}
	if (!MPT_socket_active(&od->con.out.sock)) {
		MPT_STRUCT(stream) *srm;
		
		if (!(srm = (void *) od->con.out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_sync(srm, od->con.out._idlen, &od->con._wait, timeout);
	}
	while (1) {
		MPT_STRUCT(buffer) *buf;
		MPT_STRUCT(command) *ans;
		uint64_t ansid;
		uint8_t *data, idlen, smax;
		
		/* use existing data */
		if (!(od->con.out.state & MPT_OUTFLAG(Received))) {
			struct pollfd p;
			
			p.fd = od->con.out.sock._id;
			p.events = POLLIN;
			
			if ((pos = poll(&p, 1, timeout)) < 0) {
				return MPT_ERROR(BadOperation);
			}
			if (!pos) {
				return 0;
			}
			if ((pos = mpt_outdata_recv(&od->con.out)) < 0) {
				mpt_log(0, __func__, MPT_LOG(Error), "%s: %s",
				        MPT_tr("receive failed"), MPT_tr("unable to get new data"));
				return MPT_ERROR(BadOperation);
			}
			timeout = 0;
		}
		idlen = od->con.out._idlen;
		smax = od->con.out._smax;
		buf = od->con.out.buf._buf;
		data = (void *) (buf + 1);
		
		if (!buf || buf->_used < (idlen + smax)) {
			mpt_log(0, __func__, MPT_LOG(Error), "%s: %s",
			        MPT_tr("bad message size"), MPT_tr("unable to get new data"));
			return MPT_ERROR(BadValue);
		}
		data += smax;
		/* no reply message */
		if (!(data[0] & 0x80)) {
			size_t max, len;
			
			if (!(buf = od->con._wait._buf)) {
				return 0;
			}
			ans = (void *) (buf + 1);
			max = buf->_used / sizeof(*ans);
			len = 0;
			
			/* count waiting slots */
			while (max--) {
				if ((ans++)->cmd) {
					++len;
				}
			}
			return len;
		}
		od->con.out.state &= ~MPT_OUTFLAG(Received);
		data[0] &= 0x7f;
		pos = mpt_message_buf2id(data, idlen, &ansid);
		
		if (pos < 0 || pos > (int) sizeof(uintptr_t)) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message id"), pos);
			return MPT_ERROR(BadValue);
		}
		if ((ans = mpt_command_get(&od->con._wait, ansid))) {
			MPT_STRUCT(message) msg;
			
			msg.base = data + idlen;
			msg.used = buf->_used - idlen;
			msg.cont = 0;
			msg.clen = 0;
			
			if (ans->cmd(ans->arg, &msg) < 0) {
				return 0;
			}
			continue;
		}
		mpt_log(0, _func, MPT_LOG(Error), "%s (%" PRIx64 ")",
		        MPT_tr("bad reply id"), ansid);
		return MPT_ERROR(BadValue);
	}
}